

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::GetFrameTimestampTest::~GetFrameTimestampTest
          (GetFrameTimestampTest *this)

{
  ~GetFrameTimestampTest(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

GetFrameTimestampTest::~GetFrameTimestampTest (void)
{
}